

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O1

void nivalis::anon_unknown_3::ast_sub_var(ASTNode **ast,uint64_t var_id,double value,AST *out)

{
  pointer *ppAVar1;
  uint32_t opcode;
  ASTNode *__args;
  iterator __position;
  pointer pAVar2;
  anon_union_8_3_343d95dd_for_ASTNode_1 aVar3;
  undefined4 uVar4;
  size_t sVar5;
  ulong uVar6;
  
  __args = *ast;
  opcode = __args->opcode;
  __position._M_current =
       (out->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (out->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>::
    _M_realloc_insert<nivalis::Expr::ASTNode_const&>
              ((vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>> *)out,
               __position,__args);
  }
  else {
    uVar4 = *(undefined4 *)&__args->field_0x4;
    aVar3 = __args->field_1;
    (__position._M_current)->opcode = __args->opcode;
    *(undefined4 *)&(__position._M_current)->field_0x4 = uVar4;
    (__position._M_current)->field_1 = aVar3;
    ppAVar1 = &(out->
               super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
  if ((opcode == 2) && (((*ast)->field_1).ref == var_id)) {
    pAVar2 = (out->
             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    pAVar2[-1].opcode = 1;
    pAVar2[-1].field_1.val = value;
  }
  *ast = *ast + 1;
  sVar5 = OpCode::n_args(opcode);
  if (sVar5 != 0) {
    uVar6 = 0;
    do {
      ast_sub_var(ast,var_id,value,out);
      uVar6 = uVar6 + 1;
      sVar5 = OpCode::n_args(opcode);
    } while (uVar6 < sVar5);
  }
  return;
}

Assistant:

void ast_sub_var(const Expr::ASTNode** ast, uint64_t var_id, double value, Expr::AST& out) {
    const auto* init_pos = ast;
    auto opcode = (*ast)->opcode;
    out.push_back(**ast);
    if (opcode == OpCode::ref &&
        (*ast)->ref == var_id) {
        out.back().opcode = OpCode::val;
        out.back().val = value;
    }

    ++*ast;
    for (size_t i = 0; i < OpCode::n_args(opcode); ++i) {
        ast_sub_var(ast, var_id, value, out);
    }
}